

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void evaluate_merging_condition(void)

{
  int *piVar1;
  bool bVar2;
  bool bVar3;
  pointer psVar4;
  reference pvVar5;
  ostream *poVar6;
  undefined8 uVar8;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  bool merge;
  int i;
  int N_qp;
  double crnp;
  int pmerging_flag;
  vector<int,_std::allocator<int>_> N_qp_i;
  int N_qp_g;
  int N_qp_p;
  int N_qp_e;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  ostream *in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff48;
  double dVar11;
  undefined5 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff55;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_50;
  int local_4c;
  uint local_40 [6];
  vector<int,_std::allocator<int>_> local_28;
  int local_c;
  int local_8;
  int local_4;
  
  std::allocator<int>::allocator((allocator<int> *)0x148d35);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT17(in_stack_ffffffffffffff57,
                      CONCAT16(in_stack_ffffffffffffff56,
                               CONCAT15(in_stack_ffffffffffffff55,in_stack_ffffffffffffff50))),
             in_stack_ffffffffffffff48,(allocator_type *)in_stack_ffffffffffffff40);
  std::allocator<int>::~allocator((allocator<int> *)0x148d5b);
  local_40[0] = 0;
  psVar4 = std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                     ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x148d72);
  MPI_Reduce(&psVar4->N_qp_e,&local_4,1,&ompi_mpi_int,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  psVar4 = std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                     ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x148dba);
  MPI_Reduce(&psVar4->N_qp_p,&local_8,1,&ompi_mpi_int,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  psVar4 = std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                     ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x148e02);
  MPI_Reduce(&psVar4->N_qp_g,&local_c,1,&ompi_mpi_int,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
  psVar4 = std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                     ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x148e4a);
  piVar1 = psVar4->N_qp_i;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,0);
  __rhs = &ompi_mpi_comm_world;
  MPI_Reduce(piVar1,pvVar5,n_ion_populations,&ompi_mpi_int,&ompi_mpi_op_sum,0);
  if (mpi_rank == 0) {
    auVar7._0_8_ = (crpc * xlength * ylength * zlength) / (dx * dy * dz);
    uVar8 = 0;
    pmerging_now = false;
    bVar3 = std::operator==(in_stack_ffffffffffffff30,__rhs);
    if (bVar3) {
      local_4c = local_4 + local_8 + local_c;
      for (local_50 = 0; local_50 < n_ion_populations; local_50 = local_50 + 1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,(long)local_50);
        local_4c = *pvVar5 + local_4c;
      }
      if ((double)(n_ion_populations + 3) * auVar7._0_8_ < (double)local_4c) {
        pmerging_now = true;
        auVar9._0_8_ = (double)local_4c;
        auVar9._8_8_ = uVar8;
        auVar10._0_8_ = (double)(n_ion_populations + 3);
        auVar10._8_8_ = uVar8;
        auVar7._8_8_ = 0;
        auVar7 = vfnmadd213sd_fma(auVar7,auVar10,auVar9);
        *ppd = auVar7._0_8_ / auVar9._0_8_;
        poVar6 = std::operator<<((ostream *)&std::cout,"\t\x1b[36m");
        poVar6 = std::operator<<(poVar6,"ppd = ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,*ppd);
        std::operator<<(poVar6,(string *)TERM_NO_COLOR_abi_cxx11_);
      }
    }
    else {
      bVar3 = std::operator==(in_stack_ffffffffffffff30,__rhs);
      if (bVar3) {
        bVar3 = true;
        if (((double)local_4 <= auVar7._0_8_) && (bVar3 = true, (double)local_8 <= auVar7._0_8_)) {
          bVar3 = auVar7._0_8_ < (double)local_c;
        }
        for (local_58 = 0; local_58 < n_ion_populations; local_58 = local_58 + 1) {
          bVar2 = !bVar3;
          bVar3 = true;
          if (bVar2) {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,(long)local_58);
            bVar3 = auVar7._0_8_ < (double)*pvVar5;
          }
        }
        if (bVar3) {
          pmerging_now = true;
          for (local_5c = 0; local_5c < n_ion_populations + 3; local_5c = local_5c + 1) {
            ppd[local_5c] = 0.0;
          }
          if (auVar7._0_8_ < (double)local_4) {
            *ppd = ((double)local_4 - auVar7._0_8_) / (double)local_4;
          }
          if (auVar7._0_8_ < (double)local_8) {
            ppd[1] = ((double)local_8 - auVar7._0_8_) / (double)local_8;
          }
          if (auVar7._0_8_ < (double)local_c) {
            ppd[2] = ((double)local_c - auVar7._0_8_) / (double)local_c;
          }
          for (local_60 = 0; local_60 < n_ion_populations; local_60 = local_60 + 1) {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,(long)local_60);
            if (auVar7._0_8_ < (double)*pvVar5) {
              pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,(long)local_60);
              dVar11 = (double)*pvVar5 - auVar7._0_8_;
              pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,(long)local_60);
              ppd[local_60 + 3] = dVar11 / (double)*pvVar5;
            }
          }
          in_stack_ffffffffffffff40 = std::operator<<((ostream *)&std::cout,"\t\x1b[36m");
          std::operator<<(in_stack_ffffffffffffff40,"ppd =");
          for (local_64 = 0; local_64 < n_ion_populations + 3; local_64 = local_64 + 1) {
            poVar6 = std::operator<<((ostream *)&std::cout,' ');
            std::ostream::operator<<(poVar6,ppd[local_64]);
          }
          std::operator<<((ostream *)&std::cout,(string *)TERM_NO_COLOR_abi_cxx11_);
        }
      }
    }
    local_40[0] = (uint)(pmerging_now & 1);
  }
  MPI_Bcast(local_40,1,&ompi_mpi_int,0,&ompi_mpi_comm_world);
  MPI_Bcast(ppd,n_ion_populations + 3,&ompi_mpi_double,0,&ompi_mpi_comm_world);
  pmerging_now = local_40[0] == 1;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff40);
  return;
}

Assistant:

void evaluate_merging_condition()
{
    int N_qp_e, N_qp_p, N_qp_g;
    auto N_qp_i = vector<int>(n_ion_populations);
    int pmerging_flag = 0; // bools are not supported by MPI

    MPI_Reduce(&(psr->N_qp_e), &N_qp_e, 1, MPI_INT, MPI_SUM, 0, MPI_COMM_WORLD);
    MPI_Reduce(&(psr->N_qp_p), &N_qp_p, 1, MPI_INT, MPI_SUM, 0, MPI_COMM_WORLD);
    MPI_Reduce(&(psr->N_qp_g), &N_qp_g, 1, MPI_INT, MPI_SUM, 0, MPI_COMM_WORLD);
    MPI_Reduce(psr->N_qp_i, &(N_qp_i[0]), n_ion_populations, MPI_INT, MPI_SUM, 0, MPI_COMM_WORLD);

    if (mpi_rank == 0) {
        double crnp = crpc*xlength*ylength*zlength/(dx*dy*dz);
        pmerging_now = false;
        if (pmerging=="ti") {
            int N_qp;
            N_qp = N_qp_e + N_qp_p + N_qp_g;
            for (int i = 0; i < n_ion_populations; i++)
                N_qp += N_qp_i[i];
            if (N_qp>(3+n_ion_populations)*crnp) {
                pmerging_now = true;
                // portion of particles that will be deleted
                ppd[0] = (N_qp - (3+n_ion_populations)*crnp)/N_qp;
                cout<<"\t\033[36m"<<"ppd = "<<ppd[0]<<TERM_NO_COLOR;
            }
        } else if (pmerging=="nl") {
            bool merge = (N_qp_e>crnp)||(N_qp_p>crnp)||(N_qp_g>crnp);
            for (int i = 0; i < n_ion_populations; ++i)
                merge = merge || (N_qp_i[i]>crnp);
            if (merge) {
                pmerging_now = true;
                // portion of particles that will be deleted
                for (int i=0;i<3+n_ion_populations;i++)
                    ppd[i] = 0;
                if (N_qp_e>crnp)
                    ppd[0] = (N_qp_e - crnp)/N_qp_e;
                if (N_qp_p>crnp)
                    ppd[1] = (N_qp_p - crnp)/N_qp_p;
                if (N_qp_g>crnp)
                    ppd[2] = (N_qp_g - crnp)/N_qp_g;
                for (int i=0;i<n_ion_populations;i++) {
                    if (N_qp_i[i]>crnp)
                        ppd[3+i] = (N_qp_i[i] - crnp)/N_qp_i[i];
                }
                cout<<"\t\033[36m"<<"ppd =";
                for (int i=0;i<3+n_ion_populations;i++) {
                    cout<<' '<<ppd[i];
                }
                cout<<TERM_NO_COLOR;
            }
        }
        pmerging_flag = pmerging_now;
    }
    MPI_Bcast(&pmerging_flag, 1, MPI_INT, 0, MPI_COMM_WORLD);
    MPI_Bcast(ppd, 3+n_ion_populations, MPI_DOUBLE, 0, MPI_COMM_WORLD);

    pmerging_now = (pmerging_flag == 1);
}